

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase31::run(TestCase31 *this)

{
  StructDataBitCount *this_00;
  Builder builder_00;
  Builder builder_01;
  Builder builder_02;
  Builder builder_03;
  Builder builder_04;
  Reader reader;
  Reader reader_00;
  Reader reader_01;
  initializer_list<capnp::Text::Reader> list_00;
  initializer_list<unsigned_int> list_01;
  bool bVar1;
  ArrayPtr<const_char> AVar2;
  Reader value;
  ArrayPtr<const_unsigned_char> AVar3;
  ArrayPtr<unsigned_char> AVar4;
  Reader RVar5;
  undefined8 in_stack_ffffffffffffeee0;
  undefined8 uVar6;
  undefined8 in_stack_ffffffffffffeee8;
  Reader local_eb8;
  Reader local_e88;
  uint local_e58;
  uint local_e54;
  Fault local_e50;
  Fault f_6;
  uint local_e40;
  DebugExpression<unsigned_int> local_e3c;
  undefined1 local_e38 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_20;
  Reader local_de8;
  undefined1 local_dc8 [8];
  Reader list_6;
  undefined8 uStack_d90;
  undefined8 local_d88;
  undefined8 uStack_d80;
  undefined8 local_d78;
  Builder local_d70;
  uint local_d48;
  uint local_d44;
  Fault local_d40;
  Fault f_5;
  uint local_d30;
  DebugExpression<unsigned_int> local_d2c;
  undefined1 local_d28 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_19;
  undefined1 local_cf0 [8];
  Builder list_5;
  undefined8 uStack_cc0;
  undefined8 local_cb8;
  undefined8 uStack_cb0;
  undefined8 local_ca8;
  uint local_ca0;
  uint local_c9c;
  Fault local_c98;
  Fault f_4;
  uint local_c88;
  DebugExpression<unsigned_int> local_c84;
  undefined1 local_c80 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_18;
  undefined1 local_c48 [8];
  Builder list_4;
  bool local_c09;
  undefined1 auStack_c08 [7];
  bool _kj_shouldLog_13;
  size_t local_c00;
  char (*local_bf8) [4];
  undefined1 local_bf0 [8];
  DebugComparison<const_char_(&)[4],_capnp::Text::Reader> _kjCondition_17;
  bool local_ba9;
  undefined1 auStack_ba8 [7];
  bool _kj_shouldLog_12;
  size_t local_ba0;
  char (*local_b98) [4];
  undefined1 local_b90 [8];
  DebugComparison<const_char_(&)[4],_capnp::Text::Reader> _kjCondition_16;
  Fault local_b58;
  Fault f_3;
  uint local_b48;
  DebugExpression<unsigned_int> local_b44;
  undefined1 local_b40 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_15;
  Reader local_af0;
  undefined1 local_ad0 [8];
  Reader list_3;
  bool local_a81;
  undefined1 local_a80 [7];
  bool _kj_shouldLog_11;
  char (*local_a68) [4];
  undefined1 local_a60 [8];
  DebugComparison<const_char_(&)[4],_capnp::Text::Builder> _kjCondition_14;
  bool local_a09;
  undefined1 local_a08 [7];
  bool _kj_shouldLog_10;
  char (*local_9f0) [4];
  undefined1 local_9e8 [8];
  DebugComparison<const_char_(&)[4],_capnp::Text::Builder> _kjCondition_13;
  Fault local_9a8;
  Fault f_2;
  uint local_998;
  DebugExpression<unsigned_int> local_994;
  undefined1 local_990 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_12;
  undefined1 local_958 [8];
  Builder list_2;
  Reader local_920;
  StructDataBitCount *local_910;
  undefined8 local_908;
  Builder local_900;
  uint local_8e8 [2];
  bool local_8dd;
  uint local_8dc;
  uint uStack_8d8;
  bool _kj_shouldLog_9;
  DebugExpression<unsigned_int> local_8d4;
  undefined1 local_8d0 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_11;
  bool local_8a5;
  uint local_8a4;
  uint uStack_8a0;
  bool _kj_shouldLog_8;
  DebugExpression<unsigned_int> local_89c;
  undefined1 local_898 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_10;
  bool local_86d;
  uint local_86c;
  uint uStack_868;
  bool _kj_shouldLog_7;
  DebugExpression<unsigned_int> local_864;
  undefined1 local_860 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_9;
  Fault local_838;
  Fault f_1;
  uint local_828;
  DebugExpression<unsigned_int> local_824;
  undefined1 local_820 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_8;
  Reader local_7d0;
  undefined1 local_7b0 [8];
  Reader list_1;
  bool local_775;
  uint local_774;
  uint uStack_770;
  bool _kj_shouldLog_6;
  DebugExpression<unsigned_int> local_76c;
  undefined1 local_768 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_7;
  bool local_73d;
  uint local_73c;
  uint uStack_738;
  bool _kj_shouldLog_5;
  DebugExpression<unsigned_int> local_734;
  undefined1 local_730 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_6;
  bool local_705;
  uint local_704;
  uint uStack_700;
  bool _kj_shouldLog_4;
  DebugExpression<unsigned_int> local_6fc;
  undefined1 local_6f8 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_5;
  Fault local_6d0;
  Fault f;
  uint local_6c0;
  DebugExpression<unsigned_int> local_6bc;
  undefined1 local_6b8 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_4;
  undefined1 local_680 [8];
  Builder list;
  Builder local_638;
  Reader local_620;
  Reader local_5f0;
  ArrayPtr<const_unsigned_char> local_5d0;
  ArrayPtr<const_unsigned_char> local_5c0;
  bool local_5a9;
  undefined1 local_5a8 [7];
  bool _kj_shouldLog_3;
  Reader local_578;
  ArrayPtr<const_unsigned_char> local_558;
  ArrayPtr<const_unsigned_char> local_548;
  ArrayPtr<const_unsigned_char> local_538;
  undefined1 local_528 [8];
  DebugComparison<capnp::Data::Reader,_capnp::Data::Reader> _kjCondition_3;
  ArrayPtr<unsigned_char> local_4d8;
  ArrayPtr<const_unsigned_char> local_4c8;
  bool local_4b1;
  undefined1 local_4b0 [7];
  bool _kj_shouldLog_2;
  ArrayPtr<unsigned_char> local_498;
  ArrayPtr<const_unsigned_char> local_488;
  ArrayPtr<const_unsigned_char> local_478;
  undefined1 local_468 [8];
  DebugComparison<capnp::Data::Reader,_capnp::Data::Builder> _kjCondition_2;
  Builder local_420;
  Reader local_408;
  Reader local_3d8;
  ArrayPtr<const_char> local_3b8;
  bool local_3a1;
  undefined1 local_3a0 [7];
  bool _kj_shouldLog_1;
  Reader local_370;
  ArrayPtr<const_char> local_350;
  char (*local_340) [4];
  undefined1 local_338 [8];
  DebugComparison<const_char_(&)[4],_capnp::Text::Reader> _kjCondition_1;
  BuilderFor<capnp::Text> local_2f0;
  bool local_2d1;
  undefined1 local_2d0 [7];
  bool _kj_shouldLog;
  BuilderFor<capnp::Text> local_2b8;
  char (*local_2a0) [4];
  undefined1 local_298 [8];
  DebugComparison<const_char_(&)[4],_capnp::Text::Builder> _kjCondition;
  Builder local_250;
  Reader local_238;
  Reader local_208;
  ReaderFor<capnproto_test::capnp::test::TestAllTypes> local_1e8;
  Builder local_1b8;
  BuilderFor<capnproto_test::capnp::test::TestAllTypes> local_1a0;
  Builder local_178;
  BuilderFor<capnproto_test::capnp::test::TestAllTypes> local_160;
  undefined1 local_128 [8];
  Builder root;
  MallocMessageBuilder builder;
  TestCase31 *this_local;
  
  this_00 = &root._builder.dataSize;
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)this_00,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRoot<capnproto_test::capnp::test::TestAnyPointer>
            ((Builder *)local_128,(MessageBuilder *)this_00);
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            (&local_178,(Builder *)local_128);
  AnyPointer::Builder::initAs<capnproto_test::capnp::test::TestAllTypes>(&local_160,&local_178);
  builder_00._builder.capTable = (CapTableBuilder *)local_160._builder.data;
  builder_00._builder.segment = (SegmentBuilder *)local_160._builder.capTable;
  builder_00._builder.data = local_160._builder.pointers;
  builder_00._builder.pointers = (WirePointer *)local_160._builder._32_8_;
  builder_00._builder.dataSize = (int)in_stack_ffffffffffffeee0;
  builder_00._builder.pointerCount = (short)((ulong)in_stack_ffffffffffffeee0 >> 0x20);
  builder_00._builder._38_2_ = (short)((ulong)in_stack_ffffffffffffeee0 >> 0x30);
  initTestMessage(builder_00);
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            (&local_1b8,(Builder *)local_128);
  AnyPointer::Builder::getAs<capnproto_test::capnp::test::TestAllTypes>(&local_1a0,&local_1b8);
  builder_01._builder.capTable = (CapTableBuilder *)local_1a0._builder.data;
  builder_01._builder.segment = (SegmentBuilder *)local_1a0._builder.capTable;
  builder_01._builder.data = local_1a0._builder.pointers;
  builder_01._builder.pointers = (WirePointer *)local_1a0._builder._32_8_;
  builder_01._builder.dataSize = (int)in_stack_ffffffffffffeee0;
  builder_01._builder.pointerCount = (short)((ulong)in_stack_ffffffffffffeee0 >> 0x20);
  builder_01._builder._38_2_ = (short)((ulong)in_stack_ffffffffffffeee0 >> 0x30);
  checkTestMessage(builder_01);
  capnproto_test::capnp::test::TestAnyPointer::Builder::asReader(&local_238,(Builder *)local_128);
  capnproto_test::capnp::test::TestAnyPointer::Reader::getAnyPointerField(&local_208,&local_238);
  AnyPointer::Reader::getAs<capnproto_test::capnp::test::TestAllTypes>(&local_1e8,&local_208);
  reader._reader.capTable = (CapTableReader *)local_1e8._reader.data;
  reader._reader.segment = (SegmentReader *)local_1e8._reader.capTable;
  reader._reader.data = local_1e8._reader.pointers;
  reader._reader.pointers = (WirePointer *)local_1e8._reader._32_8_;
  reader._reader.dataSize = local_1e8._reader.nestingLimit;
  reader._reader.pointerCount = local_1e8._reader._44_2_;
  reader._reader._38_2_ = local_1e8._reader._46_2_;
  reader._reader._40_8_ = in_stack_ffffffffffffeee8;
  checkTestMessage(reader);
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            (&local_250,(Builder *)local_128);
  Text::Reader::Reader((Reader *)&_kjCondition.result,"foo");
  AnyPointer::Builder::setAs<capnp::Text>
            (&local_250,(ReaderFor<capnp::Text>)stack0xfffffffffffffda0);
  local_2a0 = (char (*) [4])
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(char (*) [4])"foo");
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            ((Builder *)local_2d0,(Builder *)local_128);
  AnyPointer::Builder::getAs<capnp::Text>(&local_2b8,(Builder *)local_2d0);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_capnp::Text::Builder> *)local_298,
             (DebugExpression<char_const(&)[4]> *)&local_2a0,&local_2b8);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_298);
  uVar6 = local_1e8._reader._40_8_;
  if (!bVar1) {
    local_2d1 = kj::_::Debug::shouldLog(ERROR);
    uVar6 = local_1e8._reader._40_8_;
    while (local_2d1 != false) {
      capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
                ((Builder *)&_kjCondition_1.result,(Builder *)local_128);
      AnyPointer::Builder::getAs<capnp::Text>(&local_2f0,(Builder *)&_kjCondition_1.result);
      kj::_::Debug::
      log<char_const(&)[70],kj::_::DebugComparison<char_const(&)[4],capnp::Text::Builder>&,char_const(&)[4],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
                 ,0x28,ERROR,
                 "\"failed: expected \" \"(\\\"foo\\\") == (root.getAnyPointerField().getAs<Text>())\", _kjCondition, \"foo\", root.getAnyPointerField().getAs<Text>()"
                 ,(char (*) [70])
                  "failed: expected (\"foo\") == (root.getAnyPointerField().getAs<Text>())",
                 (DebugComparison<const_char_(&)[4],_capnp::Text::Builder> *)local_298,
                 (char (*) [4])"foo",&local_2f0);
      local_2d1 = false;
    }
  }
  local_340 = (char (*) [4])
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(char (*) [4])"foo");
  capnproto_test::capnp::test::TestAnyPointer::Builder::asReader
            ((Reader *)local_3a0,(Builder *)local_128);
  capnproto_test::capnp::test::TestAnyPointer::Reader::getAnyPointerField
            (&local_370,(Reader *)local_3a0);
  local_350 = (ArrayPtr<const_char>)AnyPointer::Reader::getAs<capnp::Text>(&local_370);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_capnp::Text::Reader> *)local_338,
             (DebugExpression<char_const(&)[4]> *)&local_340,(Reader *)&local_350);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_338);
  if (!bVar1) {
    local_3a1 = kj::_::Debug::shouldLog(ERROR);
    while (local_3a1 != false) {
      capnproto_test::capnp::test::TestAnyPointer::Builder::asReader
                (&local_408,(Builder *)local_128);
      capnproto_test::capnp::test::TestAnyPointer::Reader::getAnyPointerField(&local_3d8,&local_408)
      ;
      AVar2 = (ArrayPtr<const_char>)AnyPointer::Reader::getAs<capnp::Text>(&local_3d8);
      local_3b8 = AVar2;
      kj::_::Debug::
      log<char_const(&)[81],kj::_::DebugComparison<char_const(&)[4],capnp::Text::Reader>&,char_const(&)[4],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
                 ,0x29,ERROR,
                 "\"failed: expected \" \"(\\\"foo\\\") == (root.asReader().getAnyPointerField().getAs<Text>())\", _kjCondition, \"foo\", root.asReader().getAnyPointerField().getAs<Text>()"
                 ,(char (*) [81])
                  "failed: expected (\"foo\") == (root.asReader().getAnyPointerField().getAs<Text>())"
                 ,(DebugComparison<const_char_(&)[4],_capnp::Text::Reader> *)local_338,
                 (char (*) [4])"foo",(Reader *)&local_3b8);
      local_3a1 = false;
    }
  }
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            (&local_420,(Builder *)local_128);
  value = _::data("foo");
  _kjCondition_2._48_8_ = value.super_ArrayPtr<const_unsigned_char>.ptr;
  AnyPointer::Builder::setAs<capnp::Data>
            (&local_420,(ReaderFor<capnp::Data>)value.super_ArrayPtr<const_unsigned_char>);
  local_488 = (ArrayPtr<const_unsigned_char>)_::data("foo");
  local_478 = (ArrayPtr<const_unsigned_char>)
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(Reader *)&local_488);
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            ((Builder *)local_4b0,(Builder *)local_128);
  local_498 = (ArrayPtr<unsigned_char>)AnyPointer::Builder::getAs<capnp::Data>((Builder *)local_4b0)
  ;
  kj::_::DebugExpression<capnp::Data::Reader>::operator==
            ((DebugComparison<capnp::Data::Reader,_capnp::Data::Builder> *)local_468,
             (DebugExpression<capnp::Data::Reader> *)&local_478,(Builder *)&local_498);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_468);
  if (!bVar1) {
    local_4b1 = kj::_::Debug::shouldLog(ERROR);
    while (local_4b1 != false) {
      AVar3 = (ArrayPtr<const_unsigned_char>)_::data("foo");
      local_4c8 = AVar3;
      capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
                ((Builder *)&_kjCondition_3.result,(Builder *)local_128);
      AVar4 = (ArrayPtr<unsigned_char>)
              AnyPointer::Builder::getAs<capnp::Data>((Builder *)&_kjCondition_3.result);
      local_4d8 = AVar4;
      kj::_::Debug::
      log<char_const(&)[76],kj::_::DebugComparison<capnp::Data::Reader,capnp::Data::Builder>&,capnp::Data::Reader,capnp::Data::Builder>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
                 ,0x2c,ERROR,
                 "\"failed: expected \" \"(data(\\\"foo\\\")) == (root.getAnyPointerField().getAs<Data>())\", _kjCondition, data(\"foo\"), root.getAnyPointerField().getAs<Data>()"
                 ,(char (*) [76])
                  "failed: expected (data(\"foo\")) == (root.getAnyPointerField().getAs<Data>())",
                 (DebugComparison<capnp::Data::Reader,_capnp::Data::Builder> *)local_468,
                 (Reader *)&local_4c8,(Builder *)&local_4d8);
      local_4b1 = false;
    }
  }
  local_548 = (ArrayPtr<const_unsigned_char>)_::data("foo");
  local_538 = (ArrayPtr<const_unsigned_char>)
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(Reader *)&local_548);
  capnproto_test::capnp::test::TestAnyPointer::Builder::asReader
            ((Reader *)local_5a8,(Builder *)local_128);
  capnproto_test::capnp::test::TestAnyPointer::Reader::getAnyPointerField
            (&local_578,(Reader *)local_5a8);
  local_558 = (ArrayPtr<const_unsigned_char>)AnyPointer::Reader::getAs<capnp::Data>(&local_578);
  kj::_::DebugExpression<capnp::Data::Reader>::operator==
            ((DebugComparison<capnp::Data::Reader,_capnp::Data::Reader> *)local_528,
             (DebugExpression<capnp::Data::Reader> *)&local_538,(Reader *)&local_558);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_528);
  if (!bVar1) {
    local_5a9 = kj::_::Debug::shouldLog(ERROR);
    while (local_5a9 != false) {
      AVar3 = (ArrayPtr<const_unsigned_char>)_::data("foo");
      local_5c0 = AVar3;
      capnproto_test::capnp::test::TestAnyPointer::Builder::asReader
                (&local_620,(Builder *)local_128);
      capnproto_test::capnp::test::TestAnyPointer::Reader::getAnyPointerField(&local_5f0,&local_620)
      ;
      AVar3 = (ArrayPtr<const_unsigned_char>)AnyPointer::Reader::getAs<capnp::Data>(&local_5f0);
      local_5d0 = AVar3;
      kj::_::Debug::
      log<char_const(&)[87],kj::_::DebugComparison<capnp::Data::Reader,capnp::Data::Reader>&,capnp::Data::Reader,capnp::Data::Reader>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
                 ,0x2d,ERROR,
                 "\"failed: expected \" \"(data(\\\"foo\\\")) == (root.asReader().getAnyPointerField().getAs<Data>())\", _kjCondition, data(\"foo\"), root.asReader().getAnyPointerField().getAs<Data>()"
                 ,(char (*) [87])
                  "failed: expected (data(\"foo\")) == (root.asReader().getAnyPointerField().getAs<Data>())"
                 ,(DebugComparison<capnp::Data::Reader,_capnp::Data::Reader> *)local_528,
                 (Reader *)&local_5c0,(Reader *)&local_5d0);
      local_5a9 = false;
    }
  }
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            (&local_638,(Builder *)local_128);
  list.builder.structPointerCount = 0x7b;
  list.builder.elementSize = VOID;
  list.builder._39_1_ = 0;
  list_01._M_len = 3;
  list_01._M_array = (iterator)&list.builder.structPointerCount;
  AnyPointer::Builder::setAs<capnp::List<unsigned_int,(capnp::Kind)0>>(&local_638,list_01);
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            ((Builder *)&_kjCondition_4.result,(Builder *)local_128);
  AnyPointer::Builder::getAs<capnp::List<unsigned_int,(capnp::Kind)0>>
            ((BuilderFor<capnp::List<unsigned_int,_(capnp::Kind)0>_> *)local_680,
             (Builder *)&_kjCondition_4.result);
  local_6c0 = 3;
  local_6bc = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_6c0);
  f.exception._4_4_ = List<unsigned_int,_(capnp::Kind)0>::Builder::size((Builder *)local_680);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_6b8,&local_6bc,
             (uint *)((long)&f.exception + 4));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_6b8);
  if (!bVar1) {
    _kjCondition_5._28_4_ = 3;
    _kjCondition_5._24_4_ = List<unsigned_int,_(capnp::Kind)0>::Builder::size((Builder *)local_680);
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              (&local_6d0,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
               ,0x34,FAILED,"(3u) == (list.size())","_kjCondition,3u, list.size()",
               (DebugComparison<unsigned_int,_unsigned_int> *)local_6b8,
               (uint *)&_kjCondition_5.field_0x1c,(uint *)&_kjCondition_5.result);
    kj::_::Debug::Fault::fatal(&local_6d0);
  }
  uStack_700 = 0x7b;
  local_6fc = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xfffffffffffff900);
  local_704 = List<unsigned_int,_(capnp::Kind)0>::Builder::operator[]((Builder *)local_680,0);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_6f8,&local_6fc,&local_704);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_6f8);
  if (!bVar1) {
    local_705 = kj::_::Debug::shouldLog(ERROR);
    while (local_705 != false) {
      _kjCondition_6._28_4_ = 0x7b;
      _kjCondition_6._24_4_ =
           List<unsigned_int,_(capnp::Kind)0>::Builder::operator[]((Builder *)local_680,0);
      kj::_::Debug::
      log<char_const(&)[37],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
                 ,0x35,ERROR,
                 "\"failed: expected \" \"(123u) == (list[0])\", _kjCondition, 123u, list[0]",
                 (char (*) [37])"failed: expected (123u) == (list[0])",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_6f8,
                 (uint *)&_kjCondition_6.field_0x1c,(uint *)&_kjCondition_6.result);
      local_705 = false;
    }
  }
  uStack_738 = 0x1c8;
  local_734 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xfffffffffffff8c8);
  local_73c = List<unsigned_int,_(capnp::Kind)0>::Builder::operator[]((Builder *)local_680,1);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_730,&local_734,&local_73c);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_730);
  if (!bVar1) {
    local_73d = kj::_::Debug::shouldLog(ERROR);
    while (local_73d != false) {
      _kjCondition_7._28_4_ = 0x1c8;
      _kjCondition_7._24_4_ =
           List<unsigned_int,_(capnp::Kind)0>::Builder::operator[]((Builder *)local_680,1);
      kj::_::Debug::
      log<char_const(&)[37],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
                 ,0x36,ERROR,
                 "\"failed: expected \" \"(456u) == (list[1])\", _kjCondition, 456u, list[1]",
                 (char (*) [37])"failed: expected (456u) == (list[1])",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_730,
                 (uint *)&_kjCondition_7.field_0x1c,(uint *)&_kjCondition_7.result);
      local_73d = false;
    }
  }
  uStack_770 = 0x315;
  local_76c = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xfffffffffffff890);
  local_774 = List<unsigned_int,_(capnp::Kind)0>::Builder::operator[]((Builder *)local_680,2);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_768,&local_76c,&local_774);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_768);
  if (!bVar1) {
    local_775 = kj::_::Debug::shouldLog(ERROR);
    while (local_775 != false) {
      list_1.reader._44_4_ = 0x315;
      list_1.reader.nestingLimit =
           List<unsigned_int,_(capnp::Kind)0>::Builder::operator[]((Builder *)local_680,2);
      kj::_::Debug::
      log<char_const(&)[37],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
                 ,0x37,ERROR,
                 "\"failed: expected \" \"(789u) == (list[2])\", _kjCondition, 789u, list[2]",
                 (char (*) [37])"failed: expected (789u) == (list[2])",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_768,
                 (uint *)&list_1.reader.field_0x2c,(uint *)&list_1.reader.nestingLimit);
      local_775 = false;
    }
  }
  capnproto_test::capnp::test::TestAnyPointer::Builder::asReader
            ((Reader *)&_kjCondition_8.result,(Builder *)local_128);
  capnproto_test::capnp::test::TestAnyPointer::Reader::getAnyPointerField
            (&local_7d0,(Reader *)&_kjCondition_8.result);
  AnyPointer::Reader::getAs<capnp::List<unsigned_int,(capnp::Kind)0>>
            ((ReaderFor<capnp::List<unsigned_int,_(capnp::Kind)0>_> *)local_7b0,&local_7d0);
  local_828 = 3;
  local_824 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_828);
  f_1.exception._4_4_ = List<unsigned_int,_(capnp::Kind)0>::Reader::size((Reader *)local_7b0);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_820,&local_824,
             (uint *)((long)&f_1.exception + 4));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_820);
  if (!bVar1) {
    _kjCondition_9._28_4_ = 3;
    _kjCondition_9._24_4_ = List<unsigned_int,_(capnp::Kind)0>::Reader::size((Reader *)local_7b0);
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              (&local_838,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
               ,0x3c,FAILED,"(3u) == (list.size())","_kjCondition,3u, list.size()",
               (DebugComparison<unsigned_int,_unsigned_int> *)local_820,
               (uint *)&_kjCondition_9.field_0x1c,(uint *)&_kjCondition_9.result);
    kj::_::Debug::Fault::fatal(&local_838);
  }
  uStack_868 = 0x7b;
  local_864 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xfffffffffffff798);
  local_86c = List<unsigned_int,_(capnp::Kind)0>::Reader::operator[]((Reader *)local_7b0,0);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_860,&local_864,&local_86c);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_860);
  if (!bVar1) {
    local_86d = kj::_::Debug::shouldLog(ERROR);
    while (local_86d != false) {
      _kjCondition_10._28_4_ = 0x7b;
      _kjCondition_10._24_4_ =
           List<unsigned_int,_(capnp::Kind)0>::Reader::operator[]((Reader *)local_7b0,0);
      kj::_::Debug::
      log<char_const(&)[37],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
                 ,0x3d,ERROR,
                 "\"failed: expected \" \"(123u) == (list[0])\", _kjCondition, 123u, list[0]",
                 (char (*) [37])"failed: expected (123u) == (list[0])",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_860,
                 (uint *)&_kjCondition_10.field_0x1c,(uint *)&_kjCondition_10.result);
      local_86d = false;
    }
  }
  uStack_8a0 = 0x1c8;
  local_89c = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xfffffffffffff760);
  local_8a4 = List<unsigned_int,_(capnp::Kind)0>::Reader::operator[]((Reader *)local_7b0,1);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_898,&local_89c,&local_8a4);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_898);
  if (!bVar1) {
    local_8a5 = kj::_::Debug::shouldLog(ERROR);
    while (local_8a5 != false) {
      _kjCondition_11._28_4_ = 0x1c8;
      _kjCondition_11._24_4_ =
           List<unsigned_int,_(capnp::Kind)0>::Reader::operator[]((Reader *)local_7b0,1);
      kj::_::Debug::
      log<char_const(&)[37],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
                 ,0x3e,ERROR,
                 "\"failed: expected \" \"(456u) == (list[1])\", _kjCondition, 456u, list[1]",
                 (char (*) [37])"failed: expected (456u) == (list[1])",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_898,
                 (uint *)&_kjCondition_11.field_0x1c,(uint *)&_kjCondition_11.result);
      local_8a5 = false;
    }
  }
  uStack_8d8 = 0x315;
  local_8d4 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xfffffffffffff728);
  local_8dc = List<unsigned_int,_(capnp::Kind)0>::Reader::operator[]((Reader *)local_7b0,2);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_8d0,&local_8d4,&local_8dc);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_8d0);
  if (!bVar1) {
    local_8dd = kj::_::Debug::shouldLog(ERROR);
    while (local_8dd != false) {
      local_8e8[1] = 0x315;
      local_8e8[0] = List<unsigned_int,_(capnp::Kind)0>::Reader::operator[]((Reader *)local_7b0,2);
      kj::_::Debug::
      log<char_const(&)[37],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
                 ,0x3f,ERROR,
                 "\"failed: expected \" \"(789u) == (list[2])\", _kjCondition, 789u, list[2]",
                 (char (*) [37])"failed: expected (789u) == (list[2])",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_8d0,local_8e8 + 1,local_8e8);
      local_8dd = false;
    }
  }
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            (&local_900,(Builder *)local_128);
  Text::Reader::Reader((Reader *)&list_2.builder.structDataSize,"foo");
  Text::Reader::Reader(&local_920,"bar");
  local_910 = &list_2.builder.structDataSize;
  local_908 = 2;
  list_00._M_len = 2;
  list_00._M_array = (iterator)local_910;
  AnyPointer::Builder::setAs<capnp::List<capnp::Text,(capnp::Kind)1>>(&local_900,list_00);
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            ((Builder *)&_kjCondition_12.result,(Builder *)local_128);
  AnyPointer::Builder::getAs<capnp::List<capnp::Text,(capnp::Kind)1>>
            ((BuilderFor<capnp::List<capnp::Text,_(capnp::Kind)1>_> *)local_958,
             (Builder *)&_kjCondition_12.result);
  local_998 = 2;
  local_994 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_998);
  f_2.exception._4_4_ = List<capnp::Text,_(capnp::Kind)1>::Builder::size((Builder *)local_958);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_990,&local_994,
             (uint *)((long)&f_2.exception + 4));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_990);
  if (bVar1) {
    local_9f0 = (char (*) [4])
                kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(char (*) [4])"foo");
    List<capnp::Text,_(capnp::Kind)1>::Builder::operator[]
              ((Builder *)local_a08,(Builder *)local_958,0);
    kj::_::DebugExpression<char_const(&)[4]>::operator==
              ((DebugComparison<const_char_(&)[4],_capnp::Text::Builder> *)local_9e8,
               (DebugExpression<char_const(&)[4]> *)&local_9f0,(Builder *)local_a08);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_9e8);
    if (!bVar1) {
      local_a09 = kj::_::Debug::shouldLog(ERROR);
      while (local_a09 != false) {
        List<capnp::Text,_(capnp::Kind)1>::Builder::operator[]
                  ((Builder *)&_kjCondition_14.result,(Builder *)local_958,0);
        kj::_::Debug::
        log<char_const(&)[38],kj::_::DebugComparison<char_const(&)[4],capnp::Text::Builder>&,char_const(&)[4],capnp::Text::Builder>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
                   ,0x49,ERROR,
                   "\"failed: expected \" \"(\\\"foo\\\") == (list[0])\", _kjCondition, \"foo\", list[0]"
                   ,(char (*) [38])"failed: expected (\"foo\") == (list[0])",
                   (DebugComparison<const_char_(&)[4],_capnp::Text::Builder> *)local_9e8,
                   (char (*) [4])"foo",(Builder *)&_kjCondition_14.result);
        local_a09 = false;
      }
    }
    local_a68 = (char (*) [4])
                kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(char (*) [4])0x439e6e);
    List<capnp::Text,_(capnp::Kind)1>::Builder::operator[]
              ((Builder *)local_a80,(Builder *)local_958,1);
    kj::_::DebugExpression<char_const(&)[4]>::operator==
              ((DebugComparison<const_char_(&)[4],_capnp::Text::Builder> *)local_a60,
               (DebugExpression<char_const(&)[4]> *)&local_a68,(Builder *)local_a80);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_a60);
    if (!bVar1) {
      local_a81 = kj::_::Debug::shouldLog(ERROR);
      while (local_a81 != false) {
        List<capnp::Text,_(capnp::Kind)1>::Builder::operator[]
                  ((Builder *)&list_3.reader.nestingLimit,(Builder *)local_958,1);
        kj::_::Debug::
        log<char_const(&)[38],kj::_::DebugComparison<char_const(&)[4],capnp::Text::Builder>&,char_const(&)[4],capnp::Text::Builder>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
                   ,0x4a,ERROR,
                   "\"failed: expected \" \"(\\\"bar\\\") == (list[1])\", _kjCondition, \"bar\", list[1]"
                   ,(char (*) [38])"failed: expected (\"bar\") == (list[1])",
                   (DebugComparison<const_char_(&)[4],_capnp::Text::Builder> *)local_a60,
                   (char (*) [4])0x439e6e,(Builder *)&list_3.reader.nestingLimit);
        local_a81 = false;
      }
    }
    capnproto_test::capnp::test::TestAnyPointer::Builder::asReader
              ((Reader *)&_kjCondition_15.result,(Builder *)local_128);
    capnproto_test::capnp::test::TestAnyPointer::Reader::getAnyPointerField
              (&local_af0,(Reader *)&_kjCondition_15.result);
    AnyPointer::Reader::getAs<capnp::List<capnp::Text,(capnp::Kind)1>>
              ((ReaderFor<capnp::List<capnp::Text,_(capnp::Kind)1>_> *)local_ad0,&local_af0);
    local_b48 = 2;
    local_b44 = kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_b48);
    f_3.exception._4_4_ = List<capnp::Text,_(capnp::Kind)1>::Reader::size((Reader *)local_ad0);
    kj::_::DebugExpression<unsigned_int>::operator==
              ((DebugComparison<unsigned_int,_unsigned_int> *)local_b40,&local_b44,
               (uint *)((long)&f_3.exception + 4));
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_b40);
    if (!bVar1) {
      _kjCondition_16._44_4_ = 2;
      _kjCondition_16._40_4_ = List<capnp::Text,_(capnp::Kind)1>::Reader::size((Reader *)local_ad0);
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                (&local_b58,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
                 ,0x4f,FAILED,"(2u) == (list.size())","_kjCondition,2u, list.size()",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_b40,
                 (uint *)&_kjCondition_16.field_0x2c,(uint *)&_kjCondition_16.result);
      kj::_::Debug::Fault::fatal(&local_b58);
    }
    local_b98 = (char (*) [4])
                kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(char (*) [4])"foo");
    _auStack_ba8 = (ArrayPtr<const_char>)
                   List<capnp::Text,_(capnp::Kind)1>::Reader::operator[]((Reader *)local_ad0,0);
    kj::_::DebugExpression<char_const(&)[4]>::operator==
              ((DebugComparison<const_char_(&)[4],_capnp::Text::Reader> *)local_b90,
               (DebugExpression<char_const(&)[4]> *)&local_b98,(Reader *)auStack_ba8);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_b90);
    if (!bVar1) {
      local_ba9 = kj::_::Debug::shouldLog(ERROR);
      while (local_ba9 != false) {
        RVar5 = List<capnp::Text,_(capnp::Kind)1>::Reader::operator[]((Reader *)local_ad0,0);
        _kjCondition_17._40_8_ = RVar5.super_StringPtr.content.ptr;
        kj::_::Debug::
        log<char_const(&)[38],kj::_::DebugComparison<char_const(&)[4],capnp::Text::Reader>&,char_const(&)[4],capnp::Text::Reader>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
                   ,0x50,ERROR,
                   "\"failed: expected \" \"(\\\"foo\\\") == (list[0])\", _kjCondition, \"foo\", list[0]"
                   ,(char (*) [38])"failed: expected (\"foo\") == (list[0])",
                   (DebugComparison<const_char_(&)[4],_capnp::Text::Reader> *)local_b90,
                   (char (*) [4])"foo",(Reader *)&_kjCondition_17.result);
        local_ba9 = false;
      }
    }
    local_bf8 = (char (*) [4])
                kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(char (*) [4])0x439e6e);
    _auStack_c08 = (ArrayPtr<const_char>)
                   List<capnp::Text,_(capnp::Kind)1>::Reader::operator[]((Reader *)local_ad0,1);
    kj::_::DebugExpression<char_const(&)[4]>::operator==
              ((DebugComparison<const_char_(&)[4],_capnp::Text::Reader> *)local_bf0,
               (DebugExpression<char_const(&)[4]> *)&local_bf8,(Reader *)auStack_c08);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_bf0);
    if (!bVar1) {
      local_c09 = kj::_::Debug::shouldLog(ERROR);
      while (local_c09 != false) {
        RVar5 = List<capnp::Text,_(capnp::Kind)1>::Reader::operator[]((Reader *)local_ad0,1);
        list_4.builder._32_8_ = RVar5.super_StringPtr.content.ptr;
        kj::_::Debug::
        log<char_const(&)[38],kj::_::DebugComparison<char_const(&)[4],capnp::Text::Reader>&,char_const(&)[4],capnp::Text::Reader>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
                   ,0x51,ERROR,
                   "\"failed: expected \" \"(\\\"bar\\\") == (list[1])\", _kjCondition, \"bar\", list[1]"
                   ,(char (*) [38])"failed: expected (\"bar\") == (list[1])",
                   (DebugComparison<const_char_(&)[4],_capnp::Text::Reader> *)local_bf0,
                   (char (*) [4])0x439e6e,(Reader *)&list_4.builder.structDataSize);
        local_c09 = false;
      }
    }
    capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
              ((Builder *)&_kjCondition_18.result,(Builder *)local_128);
    AnyPointer::Builder::
    initAs<capnp::List<capnproto_test::capnp::test::TestAllTypes,(capnp::Kind)3>>
              ((BuilderFor<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>_>
                *)local_c48,(Builder *)&_kjCondition_18.result,2);
    local_c88 = 2;
    local_c84 = kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_c88);
    f_4.exception._4_4_ =
         List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Builder::size
                   ((Builder *)local_c48);
    kj::_::DebugExpression<unsigned_int>::operator==
              ((DebugComparison<unsigned_int,_unsigned_int> *)local_c80,&local_c84,
               (uint *)((long)&f_4.exception + 4));
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_c80);
    if (!bVar1) {
      local_c9c = 2;
      local_ca0 = List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Builder::size
                            ((Builder *)local_c48);
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                (&local_c98,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
                 ,0x58,FAILED,"(2u) == (list.size())","_kjCondition,2u, list.size()",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_c80,&local_c9c,&local_ca0);
      kj::_::Debug::Fault::fatal(&local_c98);
    }
    List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Builder::operator[]
              ((Builder *)&list_5.builder.structDataSize,(Builder *)local_c48,0);
    builder_02._builder.capTable = (CapTableBuilder *)local_cb8;
    builder_02._builder.segment = (SegmentBuilder *)uStack_cc0;
    builder_02._builder.data = (void *)uStack_cb0;
    builder_02._builder.pointers = (WirePointer *)local_ca8;
    builder_02._builder.dataSize = (int)uVar6;
    builder_02._builder.pointerCount = SUB82(uVar6,4);
    builder_02._builder._38_2_ = SUB82(uVar6,6);
    initTestMessage(builder_02);
    capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
              ((Builder *)&_kjCondition_19.result,(Builder *)local_128);
    AnyPointer::Builder::
    getAs<capnp::List<capnproto_test::capnp::test::TestAllTypes,(capnp::Kind)3>>
              ((BuilderFor<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>_>
                *)local_cf0,(Builder *)&_kjCondition_19.result);
    local_d30 = 2;
    local_d2c = kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_d30);
    f_5.exception._4_4_ =
         List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Builder::size
                   ((Builder *)local_cf0);
    kj::_::DebugExpression<unsigned_int>::operator==
              ((DebugComparison<unsigned_int,_unsigned_int> *)local_d28,&local_d2c,
               (uint *)((long)&f_5.exception + 4));
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_d28);
    if (!bVar1) {
      local_d44 = 2;
      local_d48 = List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Builder::size
                            ((Builder *)local_cf0);
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                (&local_d40,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
                 ,0x5e,FAILED,"(2u) == (list.size())","_kjCondition,2u, list.size()",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_d28,&local_d44,&local_d48);
      kj::_::Debug::Fault::fatal(&local_d40);
    }
    List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Builder::operator[]
              (&local_d70,(Builder *)local_cf0,0);
    builder_03._builder.capTable = (CapTableBuilder *)local_d70._builder.data;
    builder_03._builder.segment = (SegmentBuilder *)local_d70._builder.capTable;
    builder_03._builder.data = local_d70._builder.pointers;
    builder_03._builder.pointers = (WirePointer *)local_d70._builder._32_8_;
    builder_03._builder.dataSize = (int)uVar6;
    builder_03._builder.pointerCount = SUB82(uVar6,4);
    builder_03._builder._38_2_ = SUB82(uVar6,6);
    checkTestMessage(builder_03);
    List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Builder::operator[]
              ((Builder *)&list_6.reader.nestingLimit,(Builder *)local_cf0,1);
    builder_04._builder.capTable = (CapTableBuilder *)local_d88;
    builder_04._builder.segment = (SegmentBuilder *)uStack_d90;
    builder_04._builder.data = (void *)uStack_d80;
    builder_04._builder.pointers = (WirePointer *)local_d78;
    builder_04._builder.dataSize = (int)uVar6;
    builder_04._builder.pointerCount = SUB82(uVar6,4);
    builder_04._builder._38_2_ = SUB82(uVar6,6);
    checkTestMessageAllZero(builder_04);
    capnproto_test::capnp::test::TestAnyPointer::Builder::asReader
              ((Reader *)&_kjCondition_20.result,(Builder *)local_128);
    capnproto_test::capnp::test::TestAnyPointer::Reader::getAnyPointerField
              (&local_de8,(Reader *)&_kjCondition_20.result);
    AnyPointer::Reader::getAs<capnp::List<capnproto_test::capnp::test::TestAllTypes,(capnp::Kind)3>>
              ((ReaderFor<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>_> *
               )local_dc8,&local_de8);
    local_e40 = 2;
    local_e3c = kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_e40);
    f_6.exception._4_4_ =
         List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Reader::size
                   ((Reader *)local_dc8);
    kj::_::DebugExpression<unsigned_int>::operator==
              ((DebugComparison<unsigned_int,_unsigned_int> *)local_e38,&local_e3c,
               (uint *)((long)&f_6.exception + 4));
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_e38);
    if (bVar1) {
      List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Reader::operator[]
                (&local_e88,(Reader *)local_dc8,0);
      reader_00._reader.capTable = (CapTableReader *)local_e88._reader.data;
      reader_00._reader.segment = (SegmentReader *)local_e88._reader.capTable;
      reader_00._reader.data = local_e88._reader.pointers;
      reader_00._reader.pointers = (WirePointer *)local_e88._reader._32_8_;
      reader_00._reader.dataSize = local_e88._reader.nestingLimit;
      reader_00._reader.pointerCount = local_e88._reader._44_2_;
      reader_00._reader._38_2_ = local_e88._reader._46_2_;
      reader_00._reader._40_8_ = in_stack_ffffffffffffeee8;
      checkTestMessage(reader_00);
      List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Reader::operator[]
                (&local_eb8,(Reader *)local_dc8,1);
      reader_01._reader.capTable = (CapTableReader *)local_eb8._reader.data;
      reader_01._reader.segment = (SegmentReader *)local_eb8._reader.capTable;
      reader_01._reader.data = local_eb8._reader.pointers;
      reader_01._reader.pointers = (WirePointer *)local_eb8._reader._32_8_;
      reader_01._reader.dataSize = local_eb8._reader.nestingLimit;
      reader_01._reader.pointerCount = local_eb8._reader._44_2_;
      reader_01._reader._38_2_ = local_eb8._reader._46_2_;
      reader_01._reader._40_8_ = in_stack_ffffffffffffeee8;
      checkTestMessageAllZero(reader_01);
      MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&root._builder.dataSize);
      return;
    }
    local_e54 = 2;
    local_e58 = List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Reader::size
                          ((Reader *)local_dc8);
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              (&local_e50,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
               ,0x66,FAILED,"(2u) == (list.size())","_kjCondition,2u, list.size()",
               (DebugComparison<unsigned_int,_unsigned_int> *)local_e38,&local_e54,&local_e58);
    kj::_::Debug::Fault::fatal(&local_e50);
  }
  _kjCondition_13._52_4_ = 2;
  _kjCondition_13._48_4_ = List<capnp::Text,_(capnp::Kind)1>::Builder::size((Builder *)local_958);
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
            (&local_9a8,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
             ,0x48,FAILED,"(2u) == (list.size())","_kjCondition,2u, list.size()",
             (DebugComparison<unsigned_int,_unsigned_int> *)local_990,
             (uint *)&_kjCondition_13.field_0x34,(uint *)&_kjCondition_13.result);
  kj::_::Debug::Fault::fatal(&local_9a8);
}

Assistant:

TEST(Any, AnyPointer) {
  MallocMessageBuilder builder;
  auto root = builder.getRoot<test::TestAnyPointer>();

  initTestMessage(root.getAnyPointerField().initAs<TestAllTypes>());
  checkTestMessage(root.getAnyPointerField().getAs<TestAllTypes>());
  checkTestMessage(root.asReader().getAnyPointerField().getAs<TestAllTypes>());

  root.getAnyPointerField().setAs<Text>("foo");
  EXPECT_EQ("foo", root.getAnyPointerField().getAs<Text>());
  EXPECT_EQ("foo", root.asReader().getAnyPointerField().getAs<Text>());

  root.getAnyPointerField().setAs<Data>(data("foo"));
  EXPECT_EQ(data("foo"), root.getAnyPointerField().getAs<Data>());
  EXPECT_EQ(data("foo"), root.asReader().getAnyPointerField().getAs<Data>());

  {
    root.getAnyPointerField().setAs<List<uint32_t>>({123, 456, 789});

    {
      List<uint32_t>::Builder list = root.getAnyPointerField().getAs<List<uint32_t>>();
      ASSERT_EQ(3u, list.size());
      EXPECT_EQ(123u, list[0]);
      EXPECT_EQ(456u, list[1]);
      EXPECT_EQ(789u, list[2]);
    }

    {
      List<uint32_t>::Reader list = root.asReader().getAnyPointerField().getAs<List<uint32_t>>();
      ASSERT_EQ(3u, list.size());
      EXPECT_EQ(123u, list[0]);
      EXPECT_EQ(456u, list[1]);
      EXPECT_EQ(789u, list[2]);
    }
  }

  {
    root.getAnyPointerField().setAs<List<Text>>({"foo", "bar"});

    {
      List<Text>::Builder list = root.getAnyPointerField().getAs<List<Text>>();
      ASSERT_EQ(2u, list.size());
      EXPECT_EQ("foo", list[0]);
      EXPECT_EQ("bar", list[1]);
    }

    {
      List<Text>::Reader list = root.asReader().getAnyPointerField().getAs<List<Text>>();
      ASSERT_EQ(2u, list.size());
      EXPECT_EQ("foo", list[0]);
      EXPECT_EQ("bar", list[1]);
    }
  }

  {
    {
      List<TestAllTypes>::Builder list = root.getAnyPointerField().initAs<List<TestAllTypes>>(2);
      ASSERT_EQ(2u, list.size());
      initTestMessage(list[0]);
    }

    {
      List<TestAllTypes>::Builder list = root.getAnyPointerField().getAs<List<TestAllTypes>>();
      ASSERT_EQ(2u, list.size());
      checkTestMessage(list[0]);
      checkTestMessageAllZero(list[1]);
    }

    {
      List<TestAllTypes>::Reader list =
          root.asReader().getAnyPointerField().getAs<List<TestAllTypes>>();
      ASSERT_EQ(2u, list.size());
      checkTestMessage(list[0]);
      checkTestMessageAllZero(list[1]);
    }
  }
}